

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O2

Ref<anurbs::Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>_> __thiscall
pybind11::detail::
argument_loader<anurbs::Model&,std::shared_ptr<anurbs::Curve<2l,anurbs::Ref<anurbs::NurbsCurveGeometry<2l>>>>>
::
call_impl<anurbs::Ref<anurbs::Curve<2l,anurbs::Ref<anurbs::NurbsCurveGeometry<2l>>>>,anurbs::Ref<anurbs::Curve<2l,anurbs::Ref<anurbs::NurbsCurveGeometry<2l>>>>(*&)(anurbs::Model&,std::shared_ptr<anurbs::Curve<2l,anurbs::Ref<anurbs::NurbsCurveGeometry<2l>>>>),0ul,1ul,pybind11::detail::void_type>
          (argument_loader<anurbs::Model&,std::shared_ptr<anurbs::Curve<2l,anurbs::Ref<anurbs::NurbsCurveGeometry<2l>>>>>
           *this,long f,undefined8 *param_3)

{
  code *pcVar1;
  itype *piVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ref<anurbs::Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>_> RVar3;
  __shared_ptr<anurbs::Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>,_(__gnu_cxx::_Lock_policy)2>
  _Stack_38;
  
  pcVar1 = (code *)*param_3;
  piVar2 = detail::type_caster_base::operator_cast_to_Model_((type_caster_base *)(f + 0x28));
  std::
  __shared_ptr<anurbs::Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ::__shared_ptr(&_Stack_38,
                 (__shared_ptr<anurbs::Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  *)(f + 0x18));
  (*pcVar1)(this,piVar2,&_Stack_38);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_38._M_refcount);
  RVar3.m_entry.
  super___shared_ptr<anurbs::Entry<anurbs::Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  RVar3.m_entry.
  super___shared_ptr<anurbs::Entry<anurbs::Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)this;
  return (Ref<anurbs::Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>_>)
         RVar3.m_entry.
         super___shared_ptr<anurbs::Entry<anurbs::Curve<2L,_anurbs::Ref<anurbs::NurbsCurveGeometry<2L>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

Return call_impl(Func &&f, index_sequence<Is...>, Guard &&) {
        return std::forward<Func>(f)(cast_op<Args>(std::move(std::get<Is>(argcasters)))...);
    }